

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect.c
# Opt level: O3

void print_externtype(wasm_externtype_t *type)

{
  undefined1 uVar1;
  char cVar2;
  wasm_valtype_vec_t *pwVar3;
  wasm_valtype_t *type_00;
  undefined8 uVar4;
  wasm_limits_t *pwVar5;
  char *__format;
  
  uVar1 = wasm_externtype_kind();
  switch(uVar1) {
  case 0:
    uVar4 = wasm_externtype_as_functype_const(type);
    printf("func ");
    pwVar3 = (wasm_valtype_vec_t *)wasm_functype_params(uVar4);
    print_valtypes(pwVar3);
    printf(" -> ");
    pwVar3 = (wasm_valtype_vec_t *)wasm_functype_results(uVar4);
    print_valtypes(pwVar3);
    return;
  case 1:
    break;
  case 2:
    uVar4 = wasm_externtype_as_tabletype_const(type);
    printf("table ");
    pwVar5 = (wasm_limits_t *)wasm_tabletype_limits(uVar4);
    print_limits(pwVar5);
    putchar(0x20);
    type_00 = (wasm_valtype_t *)wasm_tabletype_element(uVar4);
    goto LAB_0010260f;
  case 3:
    uVar4 = wasm_externtype_as_memorytype_const(type);
    printf("memory ");
    pwVar5 = (wasm_limits_t *)wasm_memorytype_limits(uVar4);
    print_limits(pwVar5);
    return;
  default:
    return;
  }
  uVar4 = wasm_externtype_as_globaltype_const(type);
  printf("global ");
  cVar2 = wasm_globaltype_mutability(uVar4);
  if (cVar2 == '\x01') {
    __format = "var";
LAB_001025f6:
    printf(__format);
  }
  else if (cVar2 == '\0') {
    __format = "const";
    goto LAB_001025f6;
  }
  putchar(0x20);
  type_00 = (wasm_valtype_t *)wasm_globaltype_content(uVar4);
LAB_0010260f:
  print_valtype(type_00);
  return;
}

Assistant:

void print_externtype(const wasm_externtype_t* type) {
  switch (wasm_externtype_kind(type)) {
    case WASM_EXTERN_FUNC: {
      const wasm_functype_t* functype =
        wasm_externtype_as_functype_const(type);
      printf("func ");
      print_valtypes(wasm_functype_params(functype));
      printf(" -> ");
      print_valtypes(wasm_functype_results(functype));
    } break;
    case WASM_EXTERN_GLOBAL: {
      const wasm_globaltype_t* globaltype =
        wasm_externtype_as_globaltype_const(type);
      printf("global ");
      print_mutability(wasm_globaltype_mutability(globaltype));
      printf(" ");
      print_valtype(wasm_globaltype_content(globaltype));
    } break;
    case WASM_EXTERN_TABLE: {
      const wasm_tabletype_t* tabletype =
        wasm_externtype_as_tabletype_const(type);
      printf("table ");
      print_limits(wasm_tabletype_limits(tabletype));
      printf(" ");
      print_valtype(wasm_tabletype_element(tabletype));
    } break;
    case WASM_EXTERN_MEMORY: {
      const wasm_memorytype_t* memorytype =
        wasm_externtype_as_memorytype_const(type);
      printf("memory ");
      print_limits(wasm_memorytype_limits(memorytype));
    } break;
  }
}